

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writter.cpp
# Opt level: O3

void Writter::WriteSolutionToJSONFile(Solution *solution,string *path)

{
  value_t vVar1;
  json_value jVar2;
  pointer pvVar3;
  NurseSolution *this;
  Solution *this_00;
  int iVar4;
  Scenario *pSVar5;
  string *psVar6;
  reference pvVar7;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar8;
  vector<NurseSolution_*,_std::allocator<NurseSolution_*>_> *pvVar9;
  Nurse *this_01;
  ShiftType *this_02;
  ulong uVar10;
  long lVar11;
  long *plVar12;
  pointer ppNVar13;
  long lVar14;
  pointer ppTVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_00;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_01;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_02;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  init_03;
  json j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  weekDays;
  ofstream fout;
  ulong local_358;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_350;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_340;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_338;
  string *local_330;
  Turn *local_328;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_320 [2];
  Solution *local_300;
  pointer local_2f8;
  pointer local_2f0;
  pointer local_2e8;
  reference local_2e0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2d8 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2b8 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_298 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_260;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_250;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_240;
  undefined1 local_230 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_220;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_210;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_200;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  long *local_170 [2];
  long local_160 [5];
  ios_base local_138 [264];
  
  local_330 = path;
  iVar4 = std::__cxx11::string::compare((char *)path);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_assign((string *)local_330);
  }
  local_350.m_type = null;
  local_300 = solution;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_350);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_350);
  pSVar5 = Scenario::getInstance();
  psVar6 = Scenario::getId_abi_cxx11_(pSVar5);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_240,psVar6);
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_350,"scenario");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_240);
  vVar1 = pvVar7->m_type;
  pvVar7->m_type = local_240.m_type;
  jVar2 = pvVar7->m_value;
  pvVar7->m_value = local_240.m_value;
  local_240.m_type = vVar1;
  local_240.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar7);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_240);
  pSVar5 = Scenario::getInstance();
  iVar4 = Scenario::getCurrentWeek(pSVar5);
  local_250.m_value = (json_value)(long)iVar4;
  local_250.m_type = number_integer;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_250);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_250);
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_350,"week");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_250);
  vVar1 = pvVar7->m_type;
  pvVar7->m_type = local_250.m_type;
  jVar2 = pvVar7->m_value;
  pvVar7->m_value = local_250.m_value;
  local_250.m_type = vVar1;
  local_250.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar7);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_250);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_260,
               (initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                )ZEXT816(0),false,array);
  pvVar7 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_350,"assignments");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_260);
  vVar1 = pvVar7->m_type;
  pvVar7->m_type = local_260.m_type;
  jVar2 = pvVar7->m_value;
  pvVar7->m_value = local_260.m_value;
  local_260.m_type = vVar1;
  local_260.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(pvVar7);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_260);
  local_338 = &local_220;
  local_230._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Mon","");
  local_340 = &local_200;
  local_210._0_8_ = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Tue","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"Wed","");
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Thu","");
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Fri","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"Sat","");
  plVar12 = local_160;
  local_170[0] = plVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Sun","");
  __l._M_len = 7;
  __l._M_array = (iterator)local_230;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_278,__l,(allocator_type *)local_320);
  lVar14 = -0xe0;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  local_358 = 0;
  while( true ) {
    this_00 = local_300;
    pvVar8 = Solution::getTurns(local_300);
    uVar10 = ((long)(pvVar8->
                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar8->
                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (uVar10 < local_358 || uVar10 - local_358 == 0) {
      std::ofstream::ofstream(local_230,(string *)local_330,_S_out);
      *(undefined8 *)(&local_220.m_type + ((json_value *)(local_230._0_8_ + -0x18))->number_integer)
           = 2;
      lVar14 = *(long *)(&local_220.m_type +
                        ((json_value *)(local_230._0_8_ + -0x18))->number_integer);
      lVar11 = lVar14;
      if (lVar14 < 1) {
        lVar11 = 0;
      }
      *(undefined8 *)(&local_220.m_type + ((json_value *)(local_230._0_8_ + -0x18))->number_integer)
           = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(&local_350,(ostream *)local_230,0 < lVar14,(uint)lVar11,0);
      std::ofstream::close();
      local_230._0_8_ = _VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_350);
      return;
    }
    pvVar8 = Solution::getTurns(this_00);
    pvVar3 = (pvVar8->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(pvVar8->
                    super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
             -0x5555555555555555;
    if (uVar10 < local_358 || uVar10 - local_358 == 0) break;
    ppTVar15 = pvVar3[local_358].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_2f8 = *(pointer *)
                 ((long)&pvVar3[local_358].super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                         _M_impl.super__Vector_impl_data + 8);
    if (ppTVar15 != local_2f8) {
      do {
        local_328 = *ppTVar15;
        pvVar9 = Turn::getNurses(local_328);
        ppNVar13 = (pvVar9->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        local_2e8 = (pvVar9->super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        local_2f0 = ppTVar15;
        if (ppNVar13 != local_2e8) {
          do {
            this = *ppNVar13;
            local_2e0 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)&local_350,"assignments");
            local_320[0].m_type = null;
            local_320[0].m_value.object = (object_t *)0x0;
            nlohmann::detail::
            to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[6],_0>
                      (local_320,(char (*) [6])"nurse");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(local_320);
            this_01 = NurseSolution::getNurse(this);
            psVar6 = Nurse::getId_abi_cxx11_(this_01);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_320 + 1,psVar6);
            init._M_len = 2;
            init._M_array = local_320;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_230,init,true,array);
            local_298[0].m_type = null;
            local_298[0].m_value.object = (object_t *)0x0;
            nlohmann::detail::
            to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[4],_0>
                      (local_298,(char (*) [4])0x11b45f);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(local_298);
            if ((ulong)((long)local_278.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_278.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= local_358) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,local_358);
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_298 + 1,
                       local_278.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_358);
            init_00._M_len = 2;
            init_00._M_array = local_298;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json(&local_220,init_00,true,array);
            local_2d8[0].m_type = null;
            local_2d8[0].m_value.object = (object_t *)0x0;
            nlohmann::detail::
            to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[10],_0>
                      (local_2d8,(char (*) [10])"shiftType");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(local_2d8);
            this_02 = Turn::getShiftType(local_328);
            psVar6 = ShiftType::getId_abi_cxx11_(this_02);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_2d8 + 1,psVar6);
            init_01._M_len = 2;
            init_01._M_array = local_2d8;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json(&local_210,init_01,true,array);
            local_2b8[0].m_type = null;
            local_2b8[0].m_value.object = (object_t *)0x0;
            nlohmann::detail::
            to_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_char[6],_0>
                      (local_2b8,(char (*) [6])"skill");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(local_2b8);
            psVar6 = Turn::getSkill_abi_cxx11_(local_328);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_2b8 + 1,psVar6);
            init_02._M_len = 2;
            init_02._M_array = local_2b8;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json(&local_200,init_02,true,array);
            init_03._M_len = 4;
            init_03._M_array =
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_230;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::push_back(local_2e0,init_03);
            lVar14 = 0x30;
            do {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)(local_230 + lVar14));
              lVar14 = lVar14 + -0x10;
            } while (lVar14 != -0x10);
            lVar14 = 0x10;
            do {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)(&local_2b8[0].m_type + lVar14));
              lVar14 = lVar14 + -0x10;
            } while (lVar14 != -0x10);
            lVar14 = 0x10;
            do {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)(&local_2d8[0].m_type + lVar14));
              lVar14 = lVar14 + -0x10;
            } while (lVar14 != -0x10);
            lVar14 = 0x10;
            do {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)(&local_298[0].m_type + lVar14));
              lVar14 = lVar14 + -0x10;
            } while (lVar14 != -0x10);
            lVar14 = 0x10;
            do {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)(&local_320[0].m_type + lVar14));
              lVar14 = lVar14 + -0x10;
            } while (lVar14 != -0x10);
            ppNVar13 = ppNVar13 + 1;
          } while (ppNVar13 != local_2e8);
        }
        ppTVar15 = local_2f0 + 1;
      } while (ppTVar15 != local_2f8);
    }
    local_358 = (ulong)((int)local_358 + 1);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void Writter::WriteSolutionToJSONFile(const Solution *solution, string path) {
    if (path == "")
        path = solPath;

    json j;

    j["scenario"] = Scenario::getInstance()->getId();
    j["week"] = Scenario::getInstance()->getCurrentWeek();
    j["assignments"] = json::array();

    vector<string> weekDays = {"Mon", "Tue", "Wed", "Thu", "Fri", "Sat", "Sun"};

    for (unsigned int day = 0; day < solution->getTurns().size(); ++day)
        for (Turn *turn : solution->getTurns().at(day))
            for (NurseSolution *nurseSolution : turn->getNurses())
                j["assignments"].push_back({
                        {"nurse", nurseSolution->getNurse()->getId()},
                        {"day", weekDays.at(day)},
                        {"shiftType", turn->getShiftType()->getId()},
                        {"skill", turn->getSkill()}
                });

    ofstream fout(path);
    fout << setw(2) << j;
    fout.close();
}